

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CropResizeLayerParams::MergeFrom
          (CropResizeLayerParams *this,CropResizeLayerParams *from)

{
  float fVar1;
  int iVar2;
  void *pvVar3;
  LogMessage *pLVar4;
  SamplingMode *pSVar5;
  BoxCoordinatesMode *pBVar6;
  LogFinisher local_89;
  LogMessage local_88;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x930b);
    pLVar4 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar3 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar3 & 0xfffffffffffffffe));
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_88,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar4 = google::protobuf::internal::LogMessage::operator<<
                       (&local_88,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_89,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(&local_88);
  }
  iVar2 = (from->targetsize_).current_size_;
  if (iVar2 != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve
              (&this->targetsize_,iVar2 + (this->targetsize_).current_size_);
    memcpy(((this->targetsize_).rep_)->elements + (this->targetsize_).current_size_,
           ((from->targetsize_).rep_)->elements,(long)(from->targetsize_).current_size_ << 3);
    (this->targetsize_).current_size_ =
         (this->targetsize_).current_size_ + (from->targetsize_).current_size_;
  }
  if ((from != (CropResizeLayerParams *)&_CropResizeLayerParams_default_instance_) &&
     (from->mode_ != (SamplingMode *)0x0)) {
    if (this->mode_ == (SamplingMode *)0x0) {
      pSVar5 = (SamplingMode *)operator_new(0x18);
      SamplingMode::SamplingMode(pSVar5);
      this->mode_ = pSVar5;
    }
    pSVar5 = from->mode_;
    if (pSVar5 == (SamplingMode *)0x0) {
      pSVar5 = (SamplingMode *)&_SamplingMode_default_instance_;
    }
    SamplingMode::MergeFrom(this->mode_,pSVar5);
  }
  if ((from != (CropResizeLayerParams *)&_CropResizeLayerParams_default_instance_) &&
     (from->boxindicesmode_ != (BoxCoordinatesMode *)0x0)) {
    if (this->boxindicesmode_ == (BoxCoordinatesMode *)0x0) {
      pBVar6 = (BoxCoordinatesMode *)operator_new(0x18);
      BoxCoordinatesMode::BoxCoordinatesMode(pBVar6);
      this->boxindicesmode_ = pBVar6;
    }
    pBVar6 = from->boxindicesmode_;
    if (pBVar6 == (BoxCoordinatesMode *)0x0) {
      pBVar6 = (BoxCoordinatesMode *)&_BoxCoordinatesMode_default_instance_;
    }
    BoxCoordinatesMode::MergeFrom(this->boxindicesmode_,pBVar6);
  }
  if (from->normalizedcoordinates_ == true) {
    this->normalizedcoordinates_ = true;
  }
  fVar1 = from->spatialscale_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    this->spatialscale_ = fVar1;
  }
  return;
}

Assistant:

void CropResizeLayerParams::MergeFrom(const CropResizeLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.CropResizeLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  targetsize_.MergeFrom(from.targetsize_);
  if (from.has_mode()) {
    mutable_mode()->::CoreML::Specification::SamplingMode::MergeFrom(from.mode());
  }
  if (from.has_boxindicesmode()) {
    mutable_boxindicesmode()->::CoreML::Specification::BoxCoordinatesMode::MergeFrom(from.boxindicesmode());
  }
  if (from.normalizedcoordinates() != 0) {
    set_normalizedcoordinates(from.normalizedcoordinates());
  }
  if (from.spatialscale() != 0) {
    set_spatialscale(from.spatialscale());
  }
}